

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_group(xml_parser *this,char_t *s,char_t endch)

{
  bool bVar1;
  long local_30;
  size_t depth;
  char_t *pcStack_20;
  char_t endch_local;
  char_t *s_local;
  xml_parser *this_local;
  
  local_30 = 0;
  if ((*s == '<') || (bVar1 = false, *s == '\0')) {
    bVar1 = s[1] == '!';
  }
  if (!bVar1) {
    __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xbc6,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                 );
  }
  pcStack_20 = s + 2;
  while (*pcStack_20 != '\0') {
    if (((*pcStack_20 == '<') && (pcStack_20[1] == '!')) && (pcStack_20[2] != '-')) {
      if (pcStack_20[2] == '[') {
        pcStack_20 = parse_doctype_ignore(this,pcStack_20);
        if (pcStack_20 == (char_t *)0x0) {
          return (char_t *)0x0;
        }
      }
      else {
        pcStack_20 = pcStack_20 + 2;
        local_30 = local_30 + 1;
      }
    }
    else if (((*pcStack_20 == '<') || (*pcStack_20 == '\"')) || (*pcStack_20 == '\'')) {
      pcStack_20 = parse_doctype_primitive(this,pcStack_20);
      if (pcStack_20 == (char_t *)0x0) {
        return (char_t *)0x0;
      }
    }
    else {
      if (*pcStack_20 == '>') {
        if (local_30 == 0) {
          return pcStack_20;
        }
        local_30 = local_30 + -1;
      }
      pcStack_20 = pcStack_20 + 1;
    }
  }
  if ((local_30 == 0) && (endch == '>')) {
    return pcStack_20;
  }
  this->error_offset = pcStack_20;
  this->error_status = status_bad_doctype;
  return (char_t *)0x0;
}

Assistant:

char_t* parse_doctype_group(char_t* s, char_t endch)
		{
			size_t depth = 0;

			assert((s[0] == '<' || s[0] == 0) && s[1] == '!');
			s += 2;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] != '-')
				{
					if (s[2] == '[')
					{
						// ignore
						s = parse_doctype_ignore(s);
						if (!s) return s;
					}
					else
					{
						// some control group
						s += 2;
						depth++;
					}
				}
				else if (s[0] == '<' || s[0] == '"' || s[0] == '\'')
				{
					// unknown tag (forbidden), or some primitive group
					s = parse_doctype_primitive(s);
					if (!s) return s;
				}
				else if (*s == '>')
				{
					if (depth == 0)
						return s;

					depth--;
					s++;
				}
				else s++;
			}

			if (depth != 0 || endch != '>') PUGI__THROW_ERROR(status_bad_doctype, s);

			return s;
		}